

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Execute<duckdb::string_t,long,duckdb::ArgMinMaxState<duckdb::string_t,long>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,ArgMinMaxState<duckdb::string_t,_long> *state
          ,string_t x_data,long y_data,AggregateBinaryInput *binary)

{
  bool bVar1;
  long local_30;
  anon_union_16_2_67f50693_for_value local_28;
  
  local_28.pointer.ptr = (char *)x_data.value._0_8_;
  local_30 = x_data.value._8_8_;
  local_28._0_8_ = state;
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (*(TemplatedValidityMask<unsigned_long> **)(y_data + 0x10),
                     *(idx_t *)(y_data + 0x20));
  if ((bVar1) && (x_data.value._8_8_ < *(long *)(this + 0x18))) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (*(TemplatedValidityMask<unsigned_long> **)(y_data + 8),
                       *(idx_t *)(y_data + 0x18));
    Assign<duckdb::string_t,long,duckdb::ArgMinMaxState<duckdb::string_t,long>>
              ((ArgMinMaxState<duckdb::string_t,_long> *)this,(string_t *)&local_28.pointer,
               &local_30,!bVar1);
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}